

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<256U,_unsigned_int,_void,_true> * __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_true>::operator+=
          (uintwide_t<256U,_unsigned_int,_void,_true> *this,
          uintwide_t<256U,_unsigned_int,_void,_true> *other)

{
  iterator puVar1;
  const_iterator puVar2;
  const_iterator puVar3;
  limb_type carry_1;
  limb_type carry;
  uintwide_t<256U,_unsigned_int,_void,_true> self;
  uintwide_t<256U,_unsigned_int,_void,_true> *other_local;
  uintwide_t<256U,_unsigned_int,_void,_true> *this_local;
  
  self.values.super_array<unsigned_int,_8UL>.elems._24_8_ = other;
  if (this == other) {
    _carry_1 = *(undefined8 *)(other->values).super_array<unsigned_int,_8UL>.elems;
    self.values.super_array<unsigned_int,_8UL>.elems._0_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_8UL>.elems + 2);
    self.values.super_array<unsigned_int,_8UL>.elems._8_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_8UL>.elems + 4);
    self.values.super_array<unsigned_int,_8UL>.elems._16_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_8UL>.elems + 6);
    puVar1 = detail::array_detail::array<unsigned_int,_8UL>::begin((array<unsigned_int,_8UL> *)this)
    ;
    puVar2 = detail::array_detail::array<unsigned_int,_8UL>::cbegin
                       ((array<unsigned_int,_8UL> *)this);
    puVar3 = detail::array_detail::array<unsigned_int,_8UL>::cbegin
                       ((array<unsigned_int,_8UL> *)&carry_1);
    uintwide_t<256u,unsigned_int,void,true>::
    eval_add_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(puVar1,puVar2,puVar3,8,0);
  }
  else {
    puVar1 = detail::array_detail::array<unsigned_int,_8UL>::begin((array<unsigned_int,_8UL> *)this)
    ;
    puVar2 = detail::array_detail::array<unsigned_int,_8UL>::cbegin
                       ((array<unsigned_int,_8UL> *)this);
    puVar3 = detail::array_detail::array<unsigned_int,_8UL>::cbegin
                       ((array<unsigned_int,_8UL> *)
                        self.values.super_array<unsigned_int,_8UL>.elems._24_8_);
    uintwide_t<256u,unsigned_int,void,true>::
    eval_add_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(puVar1,puVar2,puVar3,8,0);
  }
  return this;
}

Assistant:

constexpr auto operator+=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t self(other); // NOLINT(performance-unnecessary-copy-initialization)

        // Unary addition function.
        const auto carry = eval_add_n(values.begin(), // LCOV_EXCL_LINE
                                      values.cbegin(),
                                      self.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }
      else
      {
        // Unary addition function.
        const auto carry = eval_add_n(values.begin(),
                                      values.cbegin(),
                                      other.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }

      return *this;
    }